

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromReadByte25AA128(FpgaIO *this,uint16_t addr,uint8_t *data,uchar chan)

{
  BasePort *pBVar1;
  bool bVar2;
  uint uVar3;
  nodeaddr_t nVar4;
  PromType local_4c;
  nodeaddr_t address;
  quadlet_t write_data;
  uint32_t result;
  PromType prom_type;
  uchar chan_local;
  uint8_t *data_local;
  FpgaIO *pFStack_18;
  uint16_t addr_local;
  FpgaIO *this_local;
  
  if (chan == '\x01') {
    local_4c = PROM_25AA128_1;
  }
  else {
    local_4c = PROM_25AA128;
    if (chan == '\x02') {
      local_4c = PROM_25AA128_2;
    }
  }
  write_data = local_4c;
  address._4_4_ = 0;
  address._0_4_ = (uint)addr << 8 | 0x3000000;
  result._3_1_ = chan;
  _prom_type = data;
  data_local._6_2_ = addr;
  pFStack_18 = this;
  nVar4 = GetPromAddress(this,local_4c,true);
  pBVar1 = (this->super_BoardIO).port;
  uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4,(ulong)(uint)address);
  if ((uVar3 & 1) == 0) {
    *_prom_type = '\0';
    this_local._7_1_ = false;
  }
  else {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    bVar2 = PromGetResult(this,(uint32_t *)((long)&address + 4),write_data);
    if (bVar2) {
      *_prom_type = (uint8_t)address._4_4_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::PromReadByte25AA128(uint16_t addr, uint8_t &data, unsigned char chan)
{
    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // 8-bit cmd + 16-bit addr (2 MSBs ignored)
    uint32_t result = 0x00000000;
    quadlet_t write_data = 0x03000000|(addr << 8);
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (port->WriteQuadlet(BoardId, address, write_data)) {
        port->PromDelay();
        // Should be ready by now...
        if (!PromGetResult(result, prom_type))
            return false;
        // Get the last 8-bit of result
        data = result & 0xFF;
        return true;
    } else {
        data = 0x00;
        return false;
    }
}